

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ZeroCopyInputStream::ReadCord(ZeroCopyInputStream *this,Cord *cord,int count)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  Span<char> SVar5;
  Span<const_char> SVar6;
  Span<char> SVar7;
  CordBuffer local_e8;
  Span<char> local_d8;
  Span<char> local_c8;
  undefined4 local_b4;
  CordBuffer local_b0;
  undefined1 local_a0 [8];
  Span<const_char> in;
  anon_class_16_2_401397fb CopyBytes;
  anon_class_24_3_65f58981 AppendFullBuffer;
  anon_class_16_2_f7a091fc FetchNextChunk;
  undefined1 local_48 [8];
  Span<char> out;
  CordBuffer cord_buffer;
  undefined1 auStack_20 [4];
  int count_local;
  Cord *cord_local;
  ZeroCopyInputStream *this_local;
  
  if (count < 1) {
    this_local._7_1_ = 1;
  }
  else {
    cord_buffer.rep_.field_0._12_4_ = count;
    _auStack_20 = cord;
    cord_local = (Cord *)this;
    absl::lts_20240722::Cord::GetAppendBuffer((Cord *)&out.len_,(size_t)cord,(long)count);
    SVar5 = absl::lts_20240722::CordBuffer::available_up_to
                      ((CordBuffer *)&out.len_,(long)(int)cord_buffer.rep_.field_0._12_4_);
    CopyBytes.cord_buffer = (CordBuffer *)auStack_20;
    AppendFullBuffer.cord = (Cord **)&out.len_;
    AppendFullBuffer.cord_buffer = (CordBuffer *)((long)&cord_buffer.rep_.field_0 + 0xc);
    in.len_ = (long)&cord_buffer.rep_.field_0 + 0xc;
    CopyBytes.count = (int *)&out.len_;
    AppendFullBuffer.count = (int *)this;
    do {
      out.ptr_ = (pointer)SVar5.len_;
      local_48 = (undefined1  [8])SVar5.ptr_;
      SVar6 = ReadCord::anon_class_16_2_f7a091fc::operator()
                        ((anon_class_16_2_f7a091fc *)&AppendFullBuffer.count);
      in.ptr_ = (pointer)SVar6.len_;
      local_a0 = (undefined1  [8])SVar6.ptr_;
      bVar2 = absl::lts_20240722::Span<const_char>::empty((Span<const_char> *)local_a0);
      uVar1 = _auStack_20;
      if (bVar2) {
        absl::lts_20240722::CordBuffer::CordBuffer(&local_b0,(CordBuffer *)&out.len_);
        absl::lts_20240722::Cord::Append((Cord *)uVar1,&local_b0);
        absl::lts_20240722::CordBuffer::~CordBuffer(&local_b0);
        this_local._7_1_ = 0;
        goto LAB_0049b89d;
      }
      bVar2 = absl::lts_20240722::Span<char>::empty((Span<char> *)local_48);
      SVar7.len_ = (size_type)out.ptr_;
      SVar7.ptr_ = (pointer)local_48;
      if (bVar2) {
        SVar7 = ReadCord::anon_class_24_3_65f58981::operator()
                          ((anon_class_24_3_65f58981 *)&CopyBytes.cord_buffer);
        local_c8 = SVar7;
      }
      while( true ) {
        out.ptr_ = (pointer)SVar7.len_;
        local_48 = (undefined1  [8])SVar7.ptr_;
        sVar3 = absl::lts_20240722::Span<const_char>::size((Span<const_char> *)local_a0);
        sVar4 = absl::lts_20240722::Span<char>::size((Span<char> *)local_48);
        if (sVar3 <= sVar4) break;
        sVar3 = absl::lts_20240722::Span<char>::size((Span<char> *)local_48);
        ReadCord::anon_class_16_2_401397fb::operator()
                  ((anon_class_16_2_401397fb *)&in.len_,(Span<char> *)local_48,
                   (Span<const_char> *)local_a0,sVar3);
        SVar7 = ReadCord::anon_class_24_3_65f58981::operator()
                          ((anon_class_24_3_65f58981 *)&CopyBytes.cord_buffer);
        local_d8 = SVar7;
      }
      sVar3 = absl::lts_20240722::Span<const_char>::size((Span<const_char> *)local_a0);
      ReadCord::anon_class_16_2_401397fb::operator()
                ((anon_class_16_2_401397fb *)&in.len_,(Span<char> *)local_48,
                 (Span<const_char> *)local_a0,sVar3);
      uVar1 = _auStack_20;
      SVar5.len_ = (size_type)out.ptr_;
      SVar5.ptr_ = (pointer)local_48;
    } while (0 < (int)cord_buffer.rep_.field_0._12_4_);
    absl::lts_20240722::CordBuffer::CordBuffer(&local_e8,(CordBuffer *)&out.len_);
    absl::lts_20240722::Cord::Append((Cord *)uVar1,&local_e8);
    absl::lts_20240722::CordBuffer::~CordBuffer(&local_e8);
    this_local._7_1_ = 1;
LAB_0049b89d:
    local_b4 = 1;
    absl::lts_20240722::CordBuffer::~CordBuffer((CordBuffer *)&out.len_);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ZeroCopyInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;

  absl::CordBuffer cord_buffer = cord->GetAppendBuffer(count);
  absl::Span<char> out = cord_buffer.available_up_to(count);

  auto FetchNextChunk = [&]() -> absl::Span<const char> {
    const void* buffer;
    int size;
    if (!Next(&buffer, &size)) return {};

    if (size > count) {
      BackUp(size - count);
      size = count;
    }
    return absl::MakeConstSpan(static_cast<const char*>(buffer), size);
  };

  auto AppendFullBuffer = [&]() -> absl::Span<char> {
    cord->Append(std::move(cord_buffer));
    cord_buffer = absl::CordBuffer::CreateWithDefaultLimit(count);
    return cord_buffer.available_up_to(count);
  };

  auto CopyBytes = [&](absl::Span<char>& dst, absl::Span<const char>& src,
                       size_t bytes) {
    memcpy(dst.data(), src.data(), bytes);
    dst.remove_prefix(bytes);
    src.remove_prefix(bytes);
    count -= bytes;
    cord_buffer.IncreaseLengthBy(bytes);
  };

  do {
    absl::Span<const char> in = FetchNextChunk();
    if (in.empty()) {
      // Append whatever we have pending so far.
      cord->Append(std::move(cord_buffer));
      return false;
    }

    if (out.empty()) out = AppendFullBuffer();

    while (in.size() > out.size()) {
      CopyBytes(out, in, out.size());
      out = AppendFullBuffer();
    }

    CopyBytes(out, in, in.size());
  } while (count > 0);

  cord->Append(std::move(cord_buffer));
  return true;
}